

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_indirect_string.cpp
# Opt level: O3

void __thiscall
IndirectString_InMemoryEquality_Test::~IndirectString_InMemoryEquality_Test
          (IndirectString_InMemoryEquality_Test *this)

{
  (this->super_IndirectString).super_Test._vptr_Test = (_func_int **)&PTR__IndirectString_0026ec58;
  pstore::database::~database(&(this->super_IndirectString).db_);
  in_memory_store::~in_memory_store(&(this->super_IndirectString).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (IndirectString, InMemoryEquality) {
    auto const view = pstore::make_sstring_view ("body");
    pstore::indirect_string const x (db_, &view);
    pstore::indirect_string const y (db_, &view);

    EXPECT_EQ (x.length (), 4U);
    EXPECT_EQ (y.length (), 4U);

    pstore::shared_sstring_view owner;
    EXPECT_EQ (x.as_string_view (&owner), "body");
    EXPECT_TRUE (x == y);
    EXPECT_FALSE (x != y);
}